

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkPutOnTop(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtk2)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtkNew_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pAVar6;
  int local_40;
  int local_3c;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x31d,"Abc_Ntk_t *Abc_NtkPutOnTop(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkIsLogic(pNtk2);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x31e,"Abc_Ntk_t *Abc_NtkPutOnTop(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkPoNum(pNtk);
  iVar2 = Abc_NtkPiNum(pNtk2);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,799,"Abc_Ntk_t *Abc_NtkPutOnTop(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy(pNtk);
  Abc_NtkCleanCopy(pNtk2);
  pNtkNew_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtkNew_00->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
  pNtkNew_00->pSpec = pcVar3;
  for (local_3c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar4 = Abc_NtkPi(pNtk,local_3c);
    Abc_NtkDupObj(pNtkNew_00,pAVar4,1);
  }
  pVVar5 = Abc_NtkDfs(pNtk,0);
  for (local_3c = 0; iVar1 = Vec_PtrSize(pVVar5), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(pVVar5,local_3c);
    Abc_NtkDupObj(pNtkNew_00,pAVar4,0);
    for (local_40 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_40 < iVar1; local_40 = local_40 + 1) {
      pAVar6 = Abc_ObjFanin(pAVar4,local_40);
      Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar6->field_6).pCopy);
    }
  }
  Vec_PtrFree(pVVar5);
  for (local_3c = 0; iVar1 = Abc_NtkPiNum(pNtk2), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar4 = Abc_NtkPi(pNtk2,local_3c);
    pAVar6 = Abc_NtkPo(pNtk,local_3c);
    pAVar6 = Abc_ObjChild0Copy(pAVar6);
    (pAVar4->field_6).pCopy = pAVar6;
  }
  pVVar5 = Abc_NtkDfs(pNtk2,0);
  for (local_3c = 0; iVar1 = Vec_PtrSize(pVVar5), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(pVVar5,local_3c);
    Abc_NtkDupObj(pNtkNew_00,pAVar4,0);
    for (local_40 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_40 < iVar1; local_40 = local_40 + 1) {
      pAVar6 = Abc_ObjFanin(pAVar4,local_40);
      Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar6->field_6).pCopy);
    }
  }
  Vec_PtrFree(pVVar5);
  for (local_3c = 0; iVar1 = Abc_NtkPoNum(pNtk2), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar6 = Abc_NtkPo(pNtk2,local_3c);
    Abc_NtkDupObj(pNtkNew_00,pAVar6,1);
    pAVar4 = (pAVar6->field_6).pCopy;
    pAVar6 = Abc_ObjChild0Copy(pAVar6);
    Abc_ObjAddFanin(pAVar4,pAVar6);
  }
  iVar1 = Abc_NtkCheck(pNtkNew_00);
  if (iVar1 == 0) {
    fprintf(_stdout,"Abc_NtkPutOnTop(): Network check has failed.\n");
  }
  return pNtkNew_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkPutOnTop( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtk2 )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkIsLogic(pNtk2) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPiNum(pNtk2) );
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkCleanCopy( pNtk2 );
    // duplicate the name and the spec
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // add internal nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // transfer to the POs
    Abc_NtkForEachPi( pNtk2, pObj, i )
        pObj->pCopy = Abc_ObjChild0Copy( Abc_NtkPo(pNtk, i) );
    // add internal nodes
    vNodes = Abc_NtkDfs( pNtk2, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPo( pNtk2, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
    }
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkPutOnTop(): Network check has failed.\n" );
    return pNtkNew;
}